

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O3

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  QPointF *pQVar2;
  code *pcVar3;
  long lVar4;
  int iVar5;
  QColor *color;
  long in_FS_OFFSET;
  qreal qVar6;
  QColor QVar7;
  QPointF QVar8;
  undefined8 local_30;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_28.yp = (qreal)_a[1];
      iVar5 = 0;
      goto LAB_0039473a;
    case 1:
      local_30 = *_a[1];
      local_28.yp = (qreal)&local_30;
      iVar5 = 1;
      goto LAB_0039473a;
    case 2:
      local_28.yp = (qreal)_a[1];
      iVar5 = 2;
LAB_0039473a:
      local_28.xp = 0.0;
      QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)&local_28);
      goto switchD_00394479_caseD_3;
    case 3:
      color = (QColor *)_a[1];
switchD_003944d9_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setOffset((QGraphicsDropShadowEffect *)_o,(QPointF *)color);
        return;
      }
      break;
    case 4:
      local_28.xp = *_a[1];
      local_28.yp = *_a[2];
      goto LAB_00394757;
    case 5:
      local_28.yp = *_a[1];
      local_28.xp = local_28.yp;
LAB_00394757:
      setOffset((QGraphicsDropShadowEffect *)_o,&local_28);
      goto switchD_00394479_caseD_3;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setXOffset((QGraphicsDropShadowEffect *)_o,*_a[1]);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setYOffset((QGraphicsDropShadowEffect *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      qVar6 = *_a[1];
LAB_003947a6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setBlurRadius((QGraphicsDropShadowEffect *)_o,qVar6);
        return;
      }
      break;
    case 9:
      color = (QColor *)_a[1];
switchD_003944d9_caseD_4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setColor((QGraphicsDropShadowEffect *)_o,color);
        return;
      }
      break;
    default:
      goto switchD_00394479_caseD_3;
    }
    goto LAB_003947c5;
  case ReadProperty:
    if (4 < (uint)_id) break;
    pQVar2 = (QPointF *)*_a;
    switch(_id) {
    case 0:
      QVar8 = QPixmapDropShadowFilter::offset
                        (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
      *pQVar2 = QVar8;
      break;
    case 1:
      QVar8 = QPixmapDropShadowFilter::offset
                        (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
      qVar6 = QVar8.xp;
      goto LAB_0039463c;
    case 2:
      QVar8 = QPixmapDropShadowFilter::offset
                        (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
      pQVar2->xp = QVar8.yp;
      break;
    case 3:
      qVar6 = QPixmapDropShadowFilter::blurRadius
                        (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
LAB_0039463c:
      pQVar2->xp = qVar6;
      break;
    case 4:
      QVar7 = QPixmapDropShadowFilter::color
                        (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
      pQVar2->xp = QVar7._0_8_;
      *(int *)&pQVar2->yp = QVar7.ct._4_4_;
      *(short *)((long)&pQVar2->yp + 4) = QVar7.ct._8_2_;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 5) {
      color = (QColor *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003944d9_caseD_0;
      case 1:
        puVar1 = *(undefined8 **)color;
        QVar8 = QPixmapDropShadowFilter::offset
                          (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
        local_28.yp = QVar8.yp;
        local_28.xp = (qreal)puVar1;
        break;
      case 2:
        puVar1 = *(undefined8 **)color;
        QVar8 = QPixmapDropShadowFilter::offset
                          (*(QPixmapDropShadowFilter **)(*(long *)(_o + 8) + 0xa8));
        local_28.xp = (qreal)QVar8.xp;
        local_28.yp = (qreal)puVar1;
        break;
      case 3:
        qVar6 = *(qreal *)color;
        goto LAB_003947a6;
      case 4:
        goto switchD_003944d9_caseD_4;
      }
      goto LAB_00394757;
    }
    break;
  case IndexOfMethod:
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == offsetChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar3 == blurRadiusChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar3 == colorChanged && lVar4 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
switchD_00394479_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003947c5:
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsDropShadowEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->offsetChanged((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 1: _t->blurRadiusChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 2: _t->colorChanged((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 3: _t->setOffset((*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[1]))); break;
        case 4: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qreal>>(_a[2]))); break;
        case 5: _t->setOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 6: _t->setXOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 7: _t->setYOffset((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setBlurRadius((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 9: _t->setColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QPointF & )>(_a, &QGraphicsDropShadowEffect::offsetChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(qreal )>(_a, &QGraphicsDropShadowEffect::blurRadiusChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsDropShadowEffect::*)(const QColor & )>(_a, &QGraphicsDropShadowEffect::colorChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QPointF*>(_v) = _t->offset(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->xOffset(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->yOffset(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->blurRadius(); break;
        case 4: *reinterpret_cast<QColor*>(_v) = _t->color(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOffset(*reinterpret_cast<QPointF*>(_v)); break;
        case 1: _t->setXOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setYOffset(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setBlurRadius(*reinterpret_cast<qreal*>(_v)); break;
        case 4: _t->setColor(*reinterpret_cast<QColor*>(_v)); break;
        default: break;
        }
    }
}